

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O3

vector<char,_std::allocator<char>_> * __thiscall
geometrycentral::applyPermutation<char,std::allocator<char>,std::allocator<unsigned_long>>
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,geometrycentral *this,
          vector<char,_std::allocator<char>_> *sourceData,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *permNewToOld)

{
  pointer pcVar1;
  ulong uVar2;
  pointer pcVar3;
  allocator_type local_19;
  
  std::vector<char,_std::allocator<char>_>::vector
            (__return_storage_ptr__,
             (long)(sourceData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(sourceData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_19);
  pcVar1 = (sourceData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pcVar3 = (sourceData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar3 != pcVar1) {
    uVar2 = 0;
    do {
      if (*(long *)(pcVar1 + uVar2 * 8) != -1) {
        (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar2] =
             *(char *)(*(long *)this + *(long *)(pcVar1 + uVar2 * 8));
        pcVar1 = (sourceData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar3 = (sourceData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)((long)pcVar3 - (long)pcVar1 >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T, A1> applyPermutation(const std::vector<T, A1>& sourceData, const std::vector<size_t, A2>& permNewToOld) {
  std::vector<T, A1> retVal(permNewToOld.size());
  for (size_t i = 0; i < permNewToOld.size(); i++) {
    if (permNewToOld[i] != INVALID_IND) {
      retVal[i] = sourceData[permNewToOld[i]];
    }
  }
  return retVal;
}